

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

void __thiscall
ear::GainCalculatorDirectSpeakersImpl::calculate
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          OutputGains *direct,WarningCB *warning_cb)

{
  string *psVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_t __n;
  bool isLfe;
  uint uVar4;
  int iVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  optional<int> oVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  internal_error *this_00;
  not_implemented *this_01;
  adm_error *this_02;
  pointer pbVar9;
  long lVar10;
  string *name;
  undefined8 *puVar11;
  bool bVar12;
  bool bVar13;
  string label;
  size_type __dnew;
  VectorXd gains;
  SpeakerPosition shiftedPosition;
  string local_278;
  undefined1 local_258 [8];
  DenseStorage<double,__1,__1,_1,_0> local_250;
  DirectSpeakersTypeMetadata *local_240;
  _Base_ptr local_238;
  string local_230;
  undefined8 *local_210;
  long local_208;
  type local_200;
  DenseStorage<double,__1,__1,_1,_0> local_1f8;
  undefined1 local_1e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [6];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  size_type local_108;
  variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> local_100;
  
  if (((metadata->audioPackFormatID).super_type.m_initialized == true) &&
     ((metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_02 = (adm_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "common definitions audioPackFormatID specified without any speakerLabels as specified in the common definitions file"
               ,"");
    adm_error::adm_error(this_02,(string *)local_1e8);
    __cxa_throw(this_02,&adm_error::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (**direct->_vptr_OutputGains)(direct,(long)this->_nChannels);
  uVar4 = (metadata->position).which_;
  uVar4 = (int)uVar4 >> 0x1f ^ uVar4;
  if (uVar4 != 0) {
    switch(uVar4) {
    case 1:
      this_01 = (not_implemented *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      local_230._M_dataplus._M_p = (pointer)0x12;
      local_1e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1e8,(ulong)&local_230);
      local_1d8[0]._M_dataplus._M_p = local_230._M_dataplus._M_p;
      (((pointer)local_1e8._0_8_)->_M_dataplus)._M_p = (pointer)0x6169736574726143;
      ((pointer)local_1e8._0_8_)->_M_string_length = 0x697469736f70206e;
      *(undefined2 *)&((pointer)local_1e8._0_8_)->field_2 = 0x6e6f;
      local_1e8._8_8_ = local_230._M_dataplus._M_p;
      *((long)&(((pointer)local_1e8._0_8_)->_M_dataplus)._M_p + local_230._M_dataplus._M_p) = '\0';
      not_implemented::not_implemented(this_01,(string *)local_1e8);
      __cxa_throw(this_01,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
    default:
      boost::detail::variant::forced_return<void>();
    }
  }
  isLfe = _isLfeChannel(this,metadata,warning_cb);
  (*direct->_vptr_OutputGains[3])(direct);
  local_240 = metadata;
  if ((metadata->audioPackFormatID).super_type.m_initialized != true) goto LAB_00162e6e;
  local_238 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)itu_packs_abi_cxx11_,
                     (key_type *)&(metadata->audioPackFormatID).super_type.m_storage);
  if (local_238 == (_Base_ptr)(itu_packs_abi_cxx11_ + 8)) {
LAB_00162e64:
    bVar13 = false;
  }
  else {
    _nominalSpeakerLabel
              (&local_278,this,
               (metadata->speakerLabels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar13 = false;
    local_210 = DAT_00215c40;
    bVar12 = rules == DAT_00215c40;
    if (!bVar12) {
      local_238 = local_238 + 2;
      puVar11 = rules;
      do {
        if ((puVar11[8] == puVar11[7]) ||
           (_Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (puVar11[7],puVar11[8],local_238),
           _Var6._M_current !=
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar11[8])) {
          if (puVar11[0xb] == puVar11[10]) {
            bVar13 = false;
          }
          else {
            Layout::name_abi_cxx11_(&local_230,&this->_layout);
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (puVar11[10],puVar11[0xb],&local_230);
            bVar13 = _Var6._M_current ==
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     puVar11[0xb];
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar13) {
            bVar13 = false;
          }
          else {
            __n = CONCAT44(local_278._M_string_length._4_4_,(undefined4)local_278._M_string_length);
            if ((__n != puVar11[1]) ||
               ((__n != 0 &&
                (iVar5 = bcmp((void *)CONCAT44(local_278._M_dataplus._M_p._4_4_,
                                               local_278._M_dataplus._M_p._0_4_),(void *)*puVar11,
                              __n), iVar5 != 0)))) goto LAB_00162d38;
            lVar10 = puVar11[4];
            local_208 = puVar11[5];
            bVar13 = lVar10 == local_208;
            if (!bVar13) {
              bVar13 = false;
              do {
                Layout::channelNames_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e8,&this->_layout);
                _Var6 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  (local_1e8._0_8_,local_1e8._8_8_,lVar10);
                local_200 = (type)local_1e8._8_8_;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e8);
                if ((type)_Var6._M_current == local_200) break;
                lVar10 = lVar10 + 0x28;
                bVar13 = lVar10 == local_208;
              } while (!bVar13);
            }
          }
        }
        else {
LAB_00162d38:
          bVar13 = false;
        }
        if (bVar13) {
          psVar1 = (string *)puVar11[5];
          for (name = (string *)puVar11[4]; name != psVar1;
              name = (string *)&name[1]._M_string_length) {
            oVar7 = Layout::indexForName(&this->_layout,name);
            if (((ulong)oVar7.super_type & 1) == 0) {
              this_00 = (internal_error *)__cxa_allocate_exception(0x10);
              local_1e8._0_8_ = local_1e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"mapping channel not found","");
              internal_error::internal_error(this_00,(string *)local_1e8);
              __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
            }
            (*direct->_vptr_OutputGains[2])
                      ((int)name[1]._M_dataplus._M_p,direct,(long)oVar7.super_type >> 0x20);
          }
          if (bVar13) {
            bVar13 = true;
            break;
          }
        }
        bVar13 = false;
        puVar11 = puVar11 + 0xd;
        bVar12 = puVar11 == local_210;
      } while (!bVar12);
    }
    metadata = local_240;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
        &local_278.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_),
                      local_278.field_2._M_allocated_capacity + 1);
    }
    if (bVar12) goto LAB_00162e64;
  }
  if (bVar13) {
    return;
  }
LAB_00162e6e:
  pbVar9 = (metadata->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (metadata->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar2) {
    do {
      local_1e8._0_8_ = local_1e8 + 0x10;
      pcVar3 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,pcVar3,pcVar3 + pbVar9->_M_string_length);
      _nominalSpeakerLabel(&local_278,this,(string *)local_1e8);
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((this->_channelNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->_channelNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_278);
      if (_Var8._M_current !=
          (this->_channelNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar10 = (long)(int)((ulong)((long)_Var8._M_current -
                                    (long)(this->_channelNames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if ((lVar10 < 0) ||
           ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar10)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                       );
        }
        if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[lVar10] == isLfe) {
          (*direct->_vptr_OutputGains[2])(0,direct);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
              &local_278.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_278._M_dataplus._M_p._4_4_,
                                     local_278._M_dataplus._M_p._0_4_),
                            local_278.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_1e8._0_8_ == (pointer)(local_1e8 + 0x10)) {
            return;
          }
          operator_delete((void *)local_1e8._0_8_,(ulong)((long)local_1d8[0]._M_dataplus._M_p + 1));
          return;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_) !=
          &local_278.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_278._M_dataplus._M_p._4_4_,local_278._M_dataplus._M_p._0_4_),
                        local_278.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_,(ulong)((long)local_1d8[0]._M_dataplus._M_p + 1));
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
  }
  _applyScreenEdgeLock((SpeakerPosition *)local_1e8,this,&local_240->position);
  oVar7 = _findChannelWithinBounds(this,(SpeakerPosition *)local_1e8,isLfe,1e-05);
  if (((ulong)oVar7.super_type & 1) == 0) {
    if (isLfe) {
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                        ((this->_channelNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->_channelNames).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,"LFE1");
      if (_Var8._M_current !=
          (this->_channelNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (*direct->_vptr_OutputGains[2])
                  (0,direct,(long)(int)((ulong)((long)_Var8._M_current -
                                               (long)(this->_channelNames).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
      }
    }
    else {
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::variant
                (&local_100,
                 (variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)local_1e8);
      toCartesianVector3d((Vector3d *)&local_278,&local_100);
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
                (&local_100);
      local_108 = local_278.field_2._M_allocated_capacity;
      local_118 = local_278._M_dataplus._M_p._0_4_;
      uStack_114 = local_278._M_dataplus._M_p._4_4_;
      uStack_110 = (undefined4)local_278._M_string_length;
      uStack_10c = local_278._M_string_length._4_4_;
      (**((this->_pointSourcePanner).
          super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_PointSourcePanner)(local_258);
      if (local_258[0] == '\0') {
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                      "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1f8,&local_250);
      if (local_258[0] == '\x01') {
        free(local_250.m_data);
      }
      local_258 = (undefined1  [8])&this->_isLfe;
      mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (direct,(CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
                         *)local_258,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1f8);
      free(local_1f8.m_data);
    }
  }
  else {
    (*direct->_vptr_OutputGains[2])(0,direct,(long)oVar7.super_type >> 0x20);
  }
  boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
            ((variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)local_1e8);
  return;
}

Assistant:

void GainCalculatorDirectSpeakersImpl::calculate(
      const DirectSpeakersTypeMetadata& metadata, OutputGains& direct,
      const WarningCB& warning_cb) {
    if (metadata.audioPackFormatID && metadata.speakerLabels.size() == 0)
      throw adm_error(
          "common definitions audioPackFormatID specified without any "
          "speakerLabels as specified in the common definitions file");
    direct.check_size(_nChannels);

    boost::apply_visitor(throw_if_not_implemented(), metadata.position);

    double tol = 1e-5;
    bool isLfe = _isLfeChannel(metadata, warning_cb);
    direct.zero();

    if (metadata.audioPackFormatID) {
      auto found_pack = itu_packs.find(metadata.audioPackFormatID.get());
      if (found_pack != itu_packs.end()) {
        const std::string& itu_layout_name = found_pack->second;
        std::string label = _nominalSpeakerLabel(metadata.speakerLabels[0]);

        for (const MappingRule& rule : rules) {
          if (rule_applies(rule, itu_layout_name, label, _layout)) {
            for (auto& channel_gain : rule.gains) {
              auto idx = _layout.indexForName(channel_gain.first);
              ear_assert((bool)idx, "mapping channel not found");
              direct.write(idx.get(), channel_gain.second);
            }
            return;
          }
        }
      }
    }

    // try to find a speaker that matches a speakerLabel and type; earlier
    // speakerLabel values have higher priority
    for (std::string speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      auto it =
          std::find(_channelNames.begin(), _channelNames.end(), nominalLabel);
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        if (isLfe == _isLfe[index]) {
          direct.write(index, 1.0);
          return;
        }
      }
    }
    // shift the nominal speaker position to the screen edges if specified
    SpeakerPosition shiftedPosition = _applyScreenEdgeLock(metadata.position);

    // otherwise, find the closest speaker with the correct type within the
    // given bounds
    boost::optional<int> index =
        _findChannelWithinBounds(shiftedPosition, isLfe, tol);
    if (index) {
      direct.write(boost::get(index), 1.0);
      return;
    }

    // otherwise, use the point source panner for non-LFE, and handle LFE
    // channels using downmixing rules

    if (isLfe) {
      auto it = std::find(_channelNames.begin(), _channelNames.end(), "LFE1");
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        direct.write(index, 1.0);
      }
      return;
    } else {
      Eigen::Vector3d pos = toCartesianVector3d(shiftedPosition);
      Eigen::VectorXd gains = _pointSourcePanner->handle(pos).get();
      mask_write(direct, !_isLfe, gains);
      return;
    }
  }